

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

int xmlKeepBlanksDefault(int val)

{
  int iVar1;
  int *piVar2;
  
  piVar2 = __xmlKeepBlanksDefaultValue();
  iVar1 = *piVar2;
  piVar2 = __xmlKeepBlanksDefaultValue();
  *piVar2 = val;
  if (val == 0) {
    piVar2 = __xmlIndentTreeOutput();
    *piVar2 = 1;
  }
  return iVar1;
}

Assistant:

int
xmlKeepBlanksDefault(int val) {
    int old = xmlKeepBlanksDefaultValue;

    xmlKeepBlanksDefaultValue = val;
#ifdef LIBXML_OUTPUT_ENABLED
    if (!val)
        xmlIndentTreeOutput = 1;
#endif
    return(old);
}